

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ConversionStream
          (ConversionStream *this,IReferenceCounters *pRefCounters,HLSL2GLSLConverterImpl *Converter
          ,char *InputFileName,IShaderSourceInputStreamFactory *pInputStreamFactory,Char *HLSLSource
          ,size_t NumSymbols,bool bPreserveTokens)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  ConversionStream *this_00;
  DataBlobImpl *pObj;
  char *__s;
  IObject IVar3;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  char *local_88;
  undefined1 local_80 [72];
  String *local_38;
  
  local_88 = InputFileName;
  RefCountedObject<Diligent::IHLSL2GLSLConversionStream>::RefCountedObject<>
            ((RefCountedObject<Diligent::IHLSL2GLSLConversionStream> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IHLSL2GLSLConversionStream>).
  super_RefCountedObject<Diligent::IHLSL2GLSLConversionStream>.super_IHLSL2GLSLConversionStream.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00922030;
  local_80._40_8_ = &this->m_Tokens;
  (this->m_Tokens).
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_80._40_8_;
  (this->m_Tokens).
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_80._40_8_;
  (this->m_Tokens).
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  ._M_impl._M_node._M_size = 0;
  (this->m_StructDefinitions)._M_h._M_buckets = &(this->m_StructDefinitions)._M_h._M_single_bucket;
  (this->m_StructDefinitions)._M_h._M_bucket_count = 1;
  (this->m_StructDefinitions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_StructDefinitions)._M_h._M_element_count = 0;
  (this->m_StructDefinitions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_StructDefinitions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_StructDefinitions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_PreprocessorDefinitions)._M_h._M_buckets =
       &(this->m_PreprocessorDefinitions)._M_h._M_single_bucket;
  (this->m_PreprocessorDefinitions)._M_h._M_bucket_count = 1;
  (this->m_PreprocessorDefinitions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_PreprocessorDefinitions)._M_h._M_element_count = 0;
  (this->m_PreprocessorDefinitions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_PreprocessorDefinitions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_PreprocessorDefinitions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_Objects).
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Objects).
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Objects).
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_bPreserveTokens = bPreserveTokens;
  this->m_bUseInOutLocationQualifiers = true;
  this->m_bUseRowMajorMatrices = false;
  this->m_Converter = Converter;
  local_38 = &this->m_InputFileName;
  __s = "<Unknown>";
  if (InputFileName != (char *)0x0) {
    __s = InputFileName;
  }
  local_80._32_8_ = &(this->m_InputFileName).field_2;
  (this->m_InputFileName)._M_dataplus._M_p = (pointer)local_80._32_8_;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,__s,__s + sVar2);
  if (HLSLSource == (Char *)0x0) {
    if (local_88 == (char *)0x0) {
      LogError<true,char[71]>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x1157,(char (*) [71])
                         "Input file name must not be null when HLSL source code is not provided");
    }
    if (pInputStreamFactory == (IShaderSourceInputStreamFactory *)0x0) {
      LogError<true,char[76]>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x115a,(char (*) [76])
                         "Input stream factory must not be null when HLSL source code is not provided"
                );
    }
    local_80._8_8_ = local_80 + 0x30;
    local_80._48_8_ = (long *)0x0;
    local_80._0_8_ = (_func_int **)0x0;
    (*(pInputStreamFactory->super_IObject)._vptr_IObject[4])(pInputStreamFactory);
    RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::IFileStream> *)local_80);
    if ((long *)local_80._48_8_ == (long *)0x0) {
      LogError<true,char[35],char_const*>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x115f,(char (*) [35])"Failed to open shader source file ",&local_88);
    }
    DataBlobImpl::Create((DataBlobImpl *)local_80,0,(void *)0x0);
    IVar3._vptr_IObject = (_func_int **)local_80._0_8_;
    if ((_func_int **)local_80._0_8_ != (_func_int **)0x0) {
      local_80._0_8_ = (_func_int **)0x0;
    }
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_80);
    (**(code **)(*(long *)local_80._48_8_ + 0x28))(local_80._48_8_,IVar3._vptr_IObject);
    HLSLSource = (Char *)(**(code **)((long)*IVar3._vptr_IObject + 0x30))(IVar3._vptr_IObject,0);
    iVar1 = (**(_func_int **)((long)*IVar3._vptr_IObject + 0x28))(IVar3._vptr_IObject);
    NumSymbols = CONCAT44(extraout_var,iVar1);
    if ((long *)local_80._48_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_80._48_8_ + 0x10))();
    }
  }
  else {
    IVar3._vptr_IObject = (_func_int **)0x0;
  }
  this_00 = (ConversionStream *)local_80;
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this_00,HLSLSource,HLSLSource + NumSymbols);
  InsertIncludes(this_00,(String *)local_80,pInputStreamFactory);
  Parsing::HLSLTokenizer::Tokenize
            ((TokenListType *)(local_80 + 0x30),&this->m_Converter->m_HLSLTokenizer,
             (String *)local_80);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  _M_move_assign((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_80._40_8_,
                 (_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)(local_80 + 0x30));
  std::__cxx11::
  _List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  _M_clear((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            *)(local_80 + 0x30));
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  if ((IObject *)IVar3._vptr_IObject != (IObject *)0x0) {
    (**(_func_int **)((long)*IVar3._vptr_IObject + 0x10))(IVar3._vptr_IObject);
  }
  return;
}

Assistant:

HLSL2GLSLConverterImpl::ConversionStream::ConversionStream(IReferenceCounters*              pRefCounters,
                                                           const HLSL2GLSLConverterImpl&    Converter,
                                                           const char*                      InputFileName,
                                                           IShaderSourceInputStreamFactory* pInputStreamFactory,
                                                           const Char*                      HLSLSource,
                                                           size_t                           NumSymbols,
                                                           bool                             bPreserveTokens) :
    // clang-format off
    TBase            {pRefCounters   },
    m_bPreserveTokens{bPreserveTokens},
    m_Converter      {Converter      },
    m_InputFileName  {InputFileName != nullptr ? InputFileName : "<Unknown>"}
// clang-format on
{
    RefCntAutoPtr<IDataBlob> pFileData;
    if (HLSLSource == nullptr)
    {
        if (InputFileName == nullptr)
            LOG_ERROR_AND_THROW("Input file name must not be null when HLSL source code is not provided");

        if (pInputStreamFactory == nullptr)
            LOG_ERROR_AND_THROW("Input stream factory must not be null when HLSL source code is not provided");

        RefCntAutoPtr<IFileStream> pSourceStream;
        pInputStreamFactory->CreateInputStream(InputFileName, &pSourceStream);
        if (pSourceStream == nullptr)
            LOG_ERROR_AND_THROW("Failed to open shader source file ", InputFileName);

        pFileData = DataBlobImpl::Create();
        pSourceStream->ReadBlob(pFileData);
        HLSLSource = reinterpret_cast<char*>(pFileData->GetDataPtr());
        NumSymbols = pFileData->GetSize();
    }

    String Source(HLSLSource, NumSymbols);

    InsertIncludes(Source, pInputStreamFactory);

    m_Tokens = m_Converter.m_HLSLTokenizer.Tokenize(Source);
}